

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void whereApplyPartialIndexConstraints(Expr *pTruth,int iTabCur,WhereClause *pWC)

{
  u8 uVar1;
  int iVar2;
  int iVar3;
  u16 *puVar4;
  
  uVar1 = pTruth->op;
  while (uVar1 == ',') {
    whereApplyPartialIndexConstraints(pTruth->pLeft,iTabCur,pWC);
    pTruth = pTruth->pRight;
    uVar1 = pTruth->op;
  }
  if (0 < pWC->nTerm) {
    puVar4 = &pWC->a->wtFlags;
    iVar3 = 0;
    do {
      if (((*puVar4 & 4) == 0) &&
         (iVar2 = sqlite3ExprCompare((Parse *)0x0,((WhereTerm *)(puVar4 + -9))->pExpr,pTruth,iTabCur
                                    ), iVar2 == 0)) {
        *(byte *)puVar4 = (byte)*puVar4 | 4;
      }
      iVar3 = iVar3 + 1;
      puVar4 = puVar4 + 0x1c;
    } while (iVar3 < pWC->nTerm);
  }
  return;
}

Assistant:

static void whereApplyPartialIndexConstraints(
  Expr *pTruth,
  int iTabCur,
  WhereClause *pWC
){
  int i;
  WhereTerm *pTerm;
  while( pTruth->op==TK_AND ){
    whereApplyPartialIndexConstraints(pTruth->pLeft, iTabCur, pWC);
    pTruth = pTruth->pRight;
  }
  for(i=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    Expr *pExpr;
    if( pTerm->wtFlags & TERM_CODED ) continue;
    pExpr = pTerm->pExpr;
    if( sqlite3ExprCompare(0, pExpr, pTruth, iTabCur)==0 ){
      pTerm->wtFlags |= TERM_CODED;
    }
  }
}